

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_font_bake_custom_data
               (void *img_memory,int img_width,int img_height,nk_recti img_dst,
               char *texture_data_mask,int tex_width,int tex_height,char white,char black)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (img_height != 0 && (img_width != 0 && img_memory != (void *)0x0)) {
    iVar2 = (img_dst._0_4_ >> 0x10) * img_width + (int)img_dst.x;
    iVar3 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        cVar1 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                [(int)lVar4 + lVar5];
        lVar6 = (long)(iVar2 + (int)lVar5);
        *(char *)((long)img_memory + lVar6) = -(cVar1 == '.');
        *(char *)((long)img_memory + lVar6 + 0x5b) = -(cVar1 == 'X');
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x5a);
      iVar3 = iVar3 + 1;
      lVar4 = (long)(int)lVar4 + 0x5a;
      iVar2 = iVar2 + img_width;
    } while (iVar3 != 0x1b);
  }
  return;
}

Assistant:

NK_INTERN void
nk_font_bake_custom_data(void *img_memory, int img_width, int img_height,
struct nk_recti img_dst, const char *texture_data_mask, int tex_width,
int tex_height, char white, char black)
{
nk_byte *pixels;
int y = 0;
int x = 0;
int n = 0;

NK_ASSERT(img_memory);
NK_ASSERT(img_width);
NK_ASSERT(img_height);
NK_ASSERT(texture_data_mask);
NK_UNUSED(tex_height);
if (!img_memory || !img_width || !img_height || !texture_data_mask)
return;

pixels = (nk_byte*)img_memory;
for (y = 0, n = 0; y < tex_height; ++y) {
for (x = 0; x < tex_width; ++x, ++n) {
const int off0 = ((img_dst.x + x) + (img_dst.y + y) * img_width);
const int off1 = off0 + 1 + tex_width;
pixels[off0] = (texture_data_mask[n] == white) ? 0xFF : 0x00;
pixels[off1] = (texture_data_mask[n] == black) ? 0xFF : 0x00;
}
}
}